

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

LY_ERR lys_search_localfile
                 (char **searchpaths,ly_bool cwd,char *name,char *revision,char **localfile,
                 LYS_INFORMAT *format)

{
  char cVar1;
  ly_set *set;
  char *__ptr;
  LY_ERR LVar2;
  byte bVar3;
  LY_ERR LVar4;
  int iVar5;
  char *pcVar6;
  DIR *__dirp;
  size_t sVar7;
  int *piVar8;
  dirent *pdVar9;
  char *pcVar10;
  long lVar11;
  uint uVar12;
  LYS_INFORMAT LVar13;
  char **ppcVar14;
  undefined4 uVar15;
  ulong uVar16;
  undefined8 uVar17;
  lyd_node *__name;
  undefined7 in_register_00000031;
  long lVar18;
  ly_set *dirs;
  char *match_name;
  char *str;
  LYS_INFORMAT local_12c;
  ly_set *local_128;
  char *local_120;
  LYS_INFORMAT local_114;
  char *local_110;
  long local_108;
  char *local_100;
  long local_f8;
  undefined4 local_ec;
  size_t local_e8;
  ulong local_e0;
  LYS_INFORMAT *local_d8;
  char **local_d0;
  char *local_c8;
  stat local_c0;
  
  local_120 = (char *)0x0;
  if (localfile == (char **)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","localfile",
           "lys_search_localfile");
    return LY_EINVAL;
  }
  uVar16 = CONCAT71(in_register_00000031,cwd) & 0xffffffff;
  local_c8 = revision;
  LVar4 = ly_set_new(&local_128);
  if (LVar4 != LY_SUCCESS) {
    return LVar4;
  }
  local_e8 = strlen(name);
  local_d0 = localfile;
  if ((char)uVar16 == '\0') {
    LVar4 = LY_EMEM;
    uVar17 = 0;
LAB_0015ab6c:
    uVar15 = (undefined4)uVar17;
    if ((searchpaths != (char **)0x0) && (pcVar6 = *searchpaths, pcVar6 != (char *)0x0)) {
      ppcVar14 = searchpaths + 1;
      do {
        if (((char)uVar17 == '\0') ||
           (iVar5 = strcmp((char *)*(local_128->field_2).dnodes,pcVar6), iVar5 != 0)) {
          pcVar6 = strdup(pcVar6);
          if (pcVar6 == (char *)0x0) goto LAB_0015ab3b;
          LVar4 = ly_set_add(local_128,pcVar6,'\0',(uint32_t *)0x0);
          LVar2 = LY_SUCCESS;
          if (LVar4 != LY_SUCCESS) goto LAB_0015ab5c;
        }
        else {
          uVar17 = 0;
          LVar2 = LVar4;
        }
        LVar4 = LVar2;
        uVar15 = (undefined4)uVar17;
        pcVar6 = *ppcVar14;
        ppcVar14 = ppcVar14 + 1;
      } while (pcVar6 != (char *)0x0);
    }
    __name = (lyd_node *)0x0;
    local_ec = uVar15;
    local_d8 = format;
    if (local_128->count == 0) {
      __dirp = (DIR *)0x0;
      local_12c = LYS_IN_UNKNOWN;
    }
    else {
      local_f8 = local_e8 + 1;
      local_e0 = ~local_e8;
      local_12c = LYS_IN_UNKNOWN;
      __dirp = (DIR *)0x0;
      __name = (lyd_node *)0x0;
      local_108 = 0;
      do {
        while( true ) {
          free(__name);
          uVar12 = local_128->count - 1;
          local_128->count = uVar12;
          __name = (local_128->field_2).dnodes[uVar12];
          (local_128->field_2).dnodes[uVar12] = (lyd_node *)0x0;
          ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Searching for \"%s\" in \"%s\".",name,__name);
          if (__dirp != (DIR *)0x0) {
            closedir(__dirp);
          }
          __dirp = opendir((char *)__name);
          sVar7 = strlen((char *)__name);
          if (__dirp == (DIR *)0x0) break;
          pdVar9 = readdir(__dirp);
          if (pdVar9 != (dirent *)0x0) {
            lVar18 = sVar7 + local_f8;
            do {
              set = local_128;
              if ((byte)pdVar9->d_name[0] == 0x2e) {
                if (pdVar9->d_name[1] != '\0') {
                  uVar12 = (byte)pdVar9->d_name[1] - 0x2e;
                  if (uVar12 == 0) {
                    uVar12 = (uint)(byte)pdVar9->d_name[2];
                  }
                  iVar5 = -uVar12;
                  goto LAB_0015ad15;
                }
              }
              else {
                iVar5 = 0x2e - (uint)(byte)pdVar9->d_name[0];
LAB_0015ad15:
                if (iVar5 != 0) {
                  local_110 = (char *)0x0;
                  pcVar6 = pdVar9->d_name;
                  bVar3 = pdVar9->d_type >> 1 | pdVar9->d_type << 7;
                  if (bVar3 == 5) {
LAB_0015ad4c:
                    iVar5 = asprintf(&local_110,"%s/%s",__name,pcVar6);
                    if (iVar5 == -1) {
LAB_0015b0a3:
                      LVar4 = LY_EMEM;
                      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                             "lys_search_localfile_file_type");
LAB_0015b0cc:
                      free(local_110);
                      goto LAB_0015b05e;
                    }
                    iVar5 = stat(local_110,&local_c0);
                    if (iVar5 == 0) {
                      if ((local_c0.st_mode & 0xf000) == 0x4000) goto LAB_0015adc5;
                    }
                    else {
                      piVar8 = __errno_location();
                      pcVar10 = strerror(*piVar8);
                      ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
                             "Unable to get information about \"%s\" file in \"%s\" when searching for (sub)modules (%s)"
                             ,pcVar6,__name,pcVar10);
                    }
                  }
                  else if (bVar3 == 2) {
LAB_0015adc5:
                    if (((char)local_ec == '\0') || (set->count != 0)) {
                      if ((local_110 == (char *)0x0) &&
                         (iVar5 = asprintf(&local_110,"%s/%s",__name), iVar5 == -1))
                      goto LAB_0015b0a3;
                      LVar4 = ly_set_add(set,local_110,'\0',(uint32_t *)0x0);
                      if (LVar4 != LY_SUCCESS) goto LAB_0015b0cc;
                      local_110 = (char *)0x0;
                    }
                  }
                  else if (bVar3 == 0) goto LAB_0015ad4c;
                  free(local_110);
                  sVar7 = local_e8;
                  iVar5 = strncmp(name,pcVar6,local_e8);
                  if ((iVar5 == 0) && ((cVar1 = pcVar6[sVar7], cVar1 == '@' || (cVar1 == '.')))) {
                    local_100 = (char *)strlen(pcVar6);
                    if (local_100 < (char *)0x6) {
                      if (local_100 == (char *)0x5) goto LAB_0015aeb7;
                    }
                    else {
                      iVar5 = strcmp(local_100 + (long)pcVar6 + -5,".yang");
                      if (iVar5 == 0) {
                        LVar13 = LYS_IN_YANG;
                        lVar11 = -5;
                      }
                      else {
LAB_0015aeb7:
                        iVar5 = strcmp(local_100 + (long)pcVar6 + -4,".yin");
                        if (iVar5 != 0) goto LAB_0015ae42;
                        LVar13 = LYS_IN_YIN;
                        lVar11 = -4;
                      }
                      pcVar10 = local_c8;
                      if (local_c8 != (char *)0x0) {
                        if (cVar1 != '@') {
                          local_114 = LVar13;
                          free(local_120);
                          iVar5 = asprintf(&local_120,"%s/%s",__name,pcVar6);
                          local_12c = local_114;
                          goto LAB_0015afff;
                        }
                        local_100 = pcVar6 + local_f8;
                        local_114 = LVar13;
                        sVar7 = strlen(local_c8);
                        iVar5 = strncmp(pcVar10,local_100,sVar7);
                        if (iVar5 != 0) goto LAB_0015ae42;
                        free(local_120);
                        iVar5 = asprintf(&local_120,"%s/%s",__name,pcVar6);
                        if (iVar5 != -1) {
                          local_12c = local_114;
                          goto LAB_0015b035;
                        }
LAB_0015b0e9:
                        LVar4 = LY_SUCCESS;
                        ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                               "lys_search_localfile");
                        goto LAB_0015b05e;
                      }
                      if (local_120 == (char *)0x0) {
LAB_0015afa7:
                        iVar5 = asprintf(&local_120,"%s/%s",__name,pcVar6);
                        local_12c = LVar13;
LAB_0015afff:
                        local_108 = lVar18;
                        if (iVar5 == -1) goto LAB_0015b0e9;
                      }
                      else if (cVar1 == '@') {
                        pcVar10 = pcVar6 + local_f8;
                        local_114 = LVar13;
                        LVar4 = lysp_check_date((lysp_ctx *)0x0,pcVar10,
                                                (size_t)(local_100 + lVar11 + local_e0),(char *)0x0)
                        ;
                        __ptr = local_120;
                        if ((LVar4 == LY_SUCCESS) &&
                           ((local_120[local_108] != '@' ||
                            (iVar5 = strncmp(local_120 + local_108 + 1,pcVar10,10), iVar5 < 0)))) {
                          free(__ptr);
                          LVar13 = local_114;
                          goto LAB_0015afa7;
                        }
                      }
                    }
                  }
                }
              }
LAB_0015ae42:
              pdVar9 = readdir(__dirp);
            } while (pdVar9 != (dirent *)0x0);
          }
          if (local_128->count == 0) goto LAB_0015b035;
        }
        piVar8 = __errno_location();
        pcVar6 = strerror(*piVar8);
        ly_log((ly_ctx *)0x0,LY_LLWRN,LY_SUCCESS,
               "Unable to open directory \"%s\" for searching (sub)modules (%s).",__name,pcVar6);
        __dirp = (DIR *)0x0;
      } while (local_128->count != 0);
      __dirp = (DIR *)0x0;
    }
LAB_0015b035:
    *local_d0 = local_120;
    local_120 = (char *)0x0;
    if (local_d8 != (LYS_INFORMAT *)0x0) {
      *local_d8 = local_12c;
    }
    LVar4 = LY_SUCCESS;
LAB_0015b05e:
    free(__name);
    if (__dirp != (DIR *)0x0) {
      closedir(__dirp);
    }
  }
  else {
    pcVar6 = get_current_dir_name();
    if (pcVar6 == (char *)0x0) {
      LVar4 = LY_EMEM;
LAB_0015ab3b:
      pcVar6 = (char *)0x0;
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lys_search_localfile");
    }
    else {
      LVar4 = ly_set_add(local_128,pcVar6,'\0',(uint32_t *)0x0);
      if (LVar4 == LY_SUCCESS) {
        uVar17 = CONCAT71((int7)(uVar16 >> 8),1);
        LVar4 = LY_SUCCESS;
        goto LAB_0015ab6c;
      }
    }
LAB_0015ab5c:
    free(pcVar6);
  }
  free(local_120);
  ly_set_free(local_128,free);
  return LVar4;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_search_localfile(const char * const *searchpaths, ly_bool cwd, const char *name, const char *revision,
        char **localfile, LYS_INFORMAT *format)
{
    LY_ERR ret = LY_EMEM;
    size_t len, flen, match_len = 0, dir_len;
    ly_bool implicit_cwd = 0, skip;
    char *wd;
    DIR *dir = NULL;
    struct dirent *file;
    char *match_name = NULL;
    LYS_INFORMAT format_aux, match_format = 0;
    struct ly_set *dirs;

    LY_CHECK_ARG_RET(NULL, localfile, LY_EINVAL);

    /* start to fill the dir fifo with the context's search path (if set)
     * and the current working directory */
    LY_CHECK_RET(ly_set_new(&dirs));

    len = strlen(name);
    if (cwd) {
        wd = get_current_dir_name();
        if (!wd) {
            LOGMEM(NULL);
            goto cleanup;
        } else {
            /* add implicit current working directory (./) to be searched,
             * this directory is not searched recursively */
            ret = ly_set_add(dirs, wd, 0, NULL);
            LY_CHECK_GOTO(ret, cleanup);
            implicit_cwd = 1;
        }
    }
    if (searchpaths) {
        for (uint64_t i = 0; searchpaths[i]; i++) {
            /* check for duplicities with the implicit current working directory */
            if (implicit_cwd && !strcmp(dirs->objs[0], searchpaths[i])) {
                implicit_cwd = 0;
                continue;
            }
            wd = strdup(searchpaths[i]);
            if (!wd) {
                LOGMEM(NULL);
                goto cleanup;
            } else {
                ret = ly_set_add(dirs, wd, 0, NULL);
                LY_CHECK_GOTO(ret, cleanup);
            }
        }
    }
    wd = NULL;

    /* start searching */
    while (dirs->count) {
        free(wd);

        dirs->count--;
        wd = (char *)dirs->objs[dirs->count];
        dirs->objs[dirs->count] = NULL;
        LOGVRB("Searching for \"%s\" in \"%s\".", name, wd);

        if (dir) {
            closedir(dir);
        }
        dir = opendir(wd);
        dir_len = strlen(wd);
        if (!dir) {
            LOGWRN(NULL, "Unable to open directory \"%s\" for searching (sub)modules (%s).", wd, strerror(errno));
            continue;
        }

        /* search the directory */
        while ((file = readdir(dir))) {
            if (!strcmp(".", file->d_name) || !strcmp("..", file->d_name)) {
                /* skip . and .. */
                continue;
            }

            /* check whether file type is */
            if ((ret = lys_search_localfile_file_type(file, wd, dirs, implicit_cwd, &skip))) {
                goto cleanup;
            }

            /* here we know that the item is a file which can contain a module */
            if (strncmp(name, file->d_name, len) || ((file->d_name[len] != '.') && (file->d_name[len] != '@'))) {
                /* different filename than the module we search for */
                continue;
            }

            /* get type according to filename suffix */
            flen = strlen(file->d_name);
            if ((flen >= LY_YANG_SUFFIX_LEN + 1) && !strcmp(&file->d_name[flen - LY_YANG_SUFFIX_LEN], LY_YANG_SUFFIX)) {
                format_aux = LYS_IN_YANG;
            } else if ((flen >= LY_YIN_SUFFIX_LEN + 1) && !strcmp(&file->d_name[flen - LY_YIN_SUFFIX_LEN], LY_YIN_SUFFIX)) {
                format_aux = LYS_IN_YIN;
            } else {
                /* not supported suffix/file format */
                continue;
            }

            if (revision) {
                /* we look for the specific revision, try to get it from the filename */
                if (file->d_name[len] == '@') {
                    /* check revision from the filename */
                    if (strncmp(revision, &file->d_name[len + 1], strlen(revision))) {
                        /* another revision */
                        continue;
                    } else {
                        /* exact revision */
                        free(match_name);
                        if (asprintf(&match_name, "%s/%s", wd, file->d_name) == -1) {
                            LOGMEM(NULL);
                            goto cleanup;
                        }
                        match_len = dir_len + 1 + len;
                        match_format = format_aux;
                        goto success;
                    }
                } else {
                    /* continue trying to find exact revision match, use this only if not found */
                    free(match_name);
                    if (asprintf(&match_name, "%s/%s", wd, file->d_name) == -1) {
                        LOGMEM(NULL);
                        goto cleanup;
                    }
                    match_len = dir_len + 1 + len;
                    match_format = format_aux;
                    continue;
                }
            } else {
                /* remember the revision and try to find the newest one */
                if (match_name) {
                    if ((file->d_name[len] != '@') ||
                            lysp_check_date(NULL, &file->d_name[len + 1],
                            flen - ((format_aux == LYS_IN_YANG) ? LY_YANG_SUFFIX_LEN : LY_YIN_SUFFIX_LEN) - len - 1, NULL)) {
                        continue;
                    } else if ((match_name[match_len] == '@') &&
                            (strncmp(&match_name[match_len + 1], &file->d_name[len + 1], LY_REV_SIZE - 1) >= 0)) {
                        continue;
                    }
                    free(match_name);
                }

                if (asprintf(&match_name, "%s/%s", wd, file->d_name) == -1) {
                    LOGMEM(NULL);
                    goto cleanup;
                }
                match_len = dir_len + 1 + len;
                match_format = format_aux;
                continue;
            }
        }
    }

success:
    (*localfile) = match_name;
    match_name = NULL;
    if (format) {
        (*format) = match_format;
    }
    ret = LY_SUCCESS;

cleanup:
    free(wd);
    if (dir) {
        closedir(dir);
    }
    free(match_name);
    ly_set_free(dirs, free);

    return ret;
}